

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O0

bool simdjson::westmere::anon_unknown_1::numberparsing::parse_float_fallback
               (uint8_t *ptr,double *outDouble)

{
  double dVar1;
  double dVar2;
  undefined1 local_19;
  double *outDouble_local;
  uint8_t *ptr_local;
  
  dVar1 = internal::from_chars((char *)ptr);
  *outDouble = dVar1;
  dVar1 = *outDouble;
  dVar2 = std::numeric_limits<double>::max();
  local_19 = true;
  if (dVar1 <= dVar2) {
    dVar1 = *outDouble;
    dVar2 = std::numeric_limits<double>::lowest();
    local_19 = dVar1 < dVar2;
  }
  return (bool)((local_19 ^ 0xffU) & 1);
}

Assistant:

static bool parse_float_fallback(const uint8_t *ptr, double *outDouble) {
  *outDouble = simdjson::internal::from_chars(reinterpret_cast<const char *>(ptr));
  // We do not accept infinite values.

  // Detecting finite values in a portable manner is ridiculously hard, ideally
  // we would want to do:
  // return !std::isfinite(*outDouble);
  // but that mysteriously fails under legacy/old libc++ libraries, see
  // https://github.com/simdjson/simdjson/issues/1286
  //
  // Therefore, fall back to this solution (the extra parens are there
  // to handle that max may be a macro on windows).
  return !(*outDouble > (std::numeric_limits<double>::max)() || *outDouble < std::numeric_limits<double>::lowest());
}